

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::UniformAssignCase::test
          (UniformAssignCase *this,
          vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
          *basicUniforms,
          vector<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
          *basicUniformReportsRef,ShaderProgram *program,Random *rnd)

{
  CallLogWrapper *this_00;
  ostringstream *this_01;
  ostringstream *this_02;
  ostream *this_03;
  GLuint program_00;
  uint uVar1;
  DataType DVar2;
  TestLog *pTVar3;
  _Alloc_hider _Var4;
  pointer pVVar5;
  bool bVar6;
  GLint location;
  uint uVar7;
  deUint32 dVar8;
  GLenum GVar9;
  pointer pBVar10;
  int line;
  ulong uVar11;
  VarValue *value_00;
  long lVar12;
  pointer pBVar13;
  char *msg;
  pointer pVVar14;
  long lVar15;
  anon_union_64_5_83fd6269_for_val *paVar16;
  float fVar17;
  float fVar18;
  VarValue value;
  ScopedLogSection section;
  vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
  values;
  ScopedLogSection section_2;
  GLint unit;
  undefined1 local_268 [4];
  GLfloat aGStack_264 [3];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258 [3];
  undefined4 local_228;
  TestLog *local_220;
  ScopedLogSection local_218 [2];
  TestLog local_208 [2];
  vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
  local_1f8;
  ScopedLogSection local_1d8;
  string local_1d0;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  
  dVar8 = (program->m_program).m_program;
  local_220 = ((this->super_UniformCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
              m_log;
  pTVar3 = (TestLog *)(local_1b0 + 0x10);
  local_1b0._0_8_ = pTVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"UniformAssign","");
  _local_268 = (pointer)local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_268,"Uniform value assignments","");
  tcu::ScopedLogSection::ScopedLogSection
            (local_218,local_220,(string *)local_1b0,(string *)local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_local_268 != local_258) {
    operator_delete(_local_268,local_258[0]._M_allocated_capacity + 1);
  }
  if ((TestLog *)local_1b0._0_8_ != pTVar3) {
    operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
  }
  UniformCase::assignUniforms(&this->super_UniformCase,basicUniforms,dVar8,rnd);
  tcu::TestLog::endSection(local_218[0].m_log);
  if (this->m_checkMethod == CHECKMETHOD_GET_UNIFORM) {
    local_1f8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1f8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1f8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1b0._0_8_ = pTVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"GetUniforms","");
    _local_268 = (pointer)local_258;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"Uniform value query","");
    tcu::ScopedLogSection::ScopedLogSection
              (&local_1d8,local_220,(string *)local_1b0,(string *)local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_268 != local_258) {
      operator_delete(_local_268,local_258[0]._M_allocated_capacity + 1);
    }
    if ((TestLog *)local_1b0._0_8_ != pTVar3) {
      operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
    }
    pBVar10 = (basicUniforms->
              super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(basicUniforms->
                            super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar10) >> 3) *
        0x286bca1b < 1) {
      bVar6 = true;
    }
    else {
      program_00 = (program->m_program).m_program;
      pTVar3 = ((this->super_UniformCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
               m_log;
      this_00 = &(this->super_UniformCase).super_CallLogWrapper;
      this_01 = (ostringstream *)(local_1b0 + 8);
      bVar6 = true;
      lVar12 = 0;
      do {
        pBVar13 = pBVar10 + lVar12;
        if ((((this->super_UniformCase).super_CallLogWrapper.field_0x15 & 1) == 0) ||
           (pBVar10[lVar12].elemNdx != 0)) {
          local_218[0].m_log = local_208;
          _Var4._M_p = (pBVar13->name)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_218,_Var4._M_p,_Var4._M_p + (pBVar13->name)._M_string_length);
        }
        else {
          std::__cxx11::string::rfind((char)pBVar13,0x5b);
          std::__cxx11::string::substr((ulong)local_218,(ulong)pBVar13);
        }
        location = glu::CallLogWrapper::glGetUniformLocation
                             (this_00,program_00,(GLchar *)local_218[0].m_log);
        uVar7 = glu::getDataTypeScalarSize(pBVar13->type);
        local_258[2]._0_8_ = 0xcdcdcdcdcdcdcdcd;
        local_258[2]._8_8_ = 0xcdcdcdcdcdcdcdcd;
        local_258[1]._0_8_ = 0xcdcdcdcdcdcdcdcd;
        local_258[1]._8_8_ = 0xcdcdcdcdcdcdcdcd;
        local_258[0]._M_allocated_capacity = 0xcdcdcdcdcdcdcdcd;
        local_258[0]._8_8_ = 0xcdcdcdcdcdcdcdcd;
        aGStack_264[1] = -4.3160208e+08;
        aGStack_264[2] = -4.3160208e+08;
        local_228 = -4.3160208e+08;
        if (location == -1) {
          _local_268 = (pointer)0xcdcdcdcd00000000;
          std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
          ::push_back(&local_1f8,(value_type *)local_268);
          if (pBVar13->isUsedInShader == true) {
            this_02 = (ostringstream *)(local_1b0 + 8);
            local_1b0._0_8_ = pTVar3;
            std::__cxx11::ostringstream::ostringstream(this_02);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_02,"// FAILURE: ",0xc);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_02,(pBVar13->name)._M_dataplus._M_p,
                       (pBVar13->name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_02," was used in shader, but has location -1",0x28);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(this_02);
            std::ios_base::~ios_base(local_138);
            bVar6 = false;
          }
        }
        else {
          local_268 = (undefined1  [4])pBVar13->type;
          aGStack_264[0] = -4.3160208e+08;
          if (((int)local_268 - TYPE_FLOAT < 4) ||
             ((int)local_268 - TYPE_FLOAT_MAT2 < 9 || (int)local_268 - TYPE_DOUBLE_MAT2 < 9)) {
            glu::CallLogWrapper::glGetUniformfv
                      (this_00,program_00,location,(GLfloat *)(local_268 + 4));
            dVar8 = glu::CallLogWrapper::glGetError(this_00);
            line = 0x51b;
            msg = "glGetUniformfv(programGL, location, &value.val.floatV[0])";
LAB_0051f806:
            glu::checkError(dVar8,msg,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                            ,line);
          }
          else {
            if ((int)local_268 - TYPE_INT < 4) {
              glu::CallLogWrapper::glGetUniformiv
                        (this_00,program_00,location,(GLint *)(local_268 + 4));
              dVar8 = glu::CallLogWrapper::glGetError(this_00);
              line = 0x51d;
              msg = "glGetUniformiv(programGL, location, &value.val.intV[0])";
              goto LAB_0051f806;
            }
            if ((int)local_268 - TYPE_UINT < 4) {
              glu::CallLogWrapper::glGetUniformuiv
                        (this_00,program_00,location,(GLuint *)(local_268 + 4));
              dVar8 = glu::CallLogWrapper::glGetError(this_00);
              line = 0x51f;
              msg = "glGetUniformuiv(programGL, location, &value.val.uintV[0])";
              goto LAB_0051f806;
            }
            if ((int)local_268 - TYPE_BOOL < 4) {
              uVar1 = *(uint *)&(this->super_UniformCase).super_CallLogWrapper.field_0x14;
              if ((uVar1 & 0x40) == 0) {
                if ((char)uVar1 < '\0') {
                  glu::CallLogWrapper::glGetUniformuiv
                            (this_00,program_00,location,(GLuint *)(local_268 + 4));
                  GVar9 = glu::CallLogWrapper::glGetError(this_00);
                  glu::checkError(GVar9,"glGetUniformuiv(programGL, location, &value.val.uintV[0])",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                                  ,0x52a);
                  if (0 < (int)uVar7) {
                    uVar11 = 0;
                    do {
                      local_268[uVar11 + 4] = *(int *)(local_268 + uVar11 * 4 + 4) != 0;
                      uVar11 = uVar11 + 1;
                    } while (uVar7 != uVar11);
                  }
                }
                else {
                  glu::CallLogWrapper::glGetUniformfv
                            (this_00,program_00,location,(GLfloat *)(local_268 + 4));
                  GVar9 = glu::CallLogWrapper::glGetError(this_00);
                  glu::checkError(GVar9,"glGetUniformfv(programGL, location, &value.val.floatV[0])",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                                  ,0x530);
                  if (0 < (int)uVar7) {
                    uVar11 = 0;
                    do {
                      local_268[uVar11 + 4] = *(float *)(local_268 + uVar11 * 4 + 4) != 0.0;
                      uVar11 = uVar11 + 1;
                    } while (uVar7 != uVar11);
                  }
                }
              }
              else {
                glu::CallLogWrapper::glGetUniformiv
                          (this_00,program_00,location,(GLint *)(local_268 + 4));
                GVar9 = glu::CallLogWrapper::glGetError(this_00);
                glu::checkError(GVar9,"glGetUniformiv(programGL, location, &value.val.intV[0])",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                                ,0x524);
                if (0 < (int)uVar7) {
                  uVar11 = 0;
                  do {
                    local_268[uVar11 + 4] = *(int *)(local_268 + uVar11 * 4 + 4) != 0;
                    uVar11 = uVar11 + 1;
                  } while (uVar7 != uVar11);
                }
              }
            }
            else if ((int)local_268 - TYPE_SAMPLER_1D < 0x1e) {
              local_1b0._0_4_ = 0xffffffff;
              glu::CallLogWrapper::glGetUniformiv(this_00,program_00,location,(GLint *)local_1b0);
              GVar9 = glu::CallLogWrapper::glGetError(this_00);
              glu::checkError(GVar9,"glGetUniformiv(programGL, location, &unit)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                              ,0x538);
              aGStack_264[0] = (GLfloat)local_1b0._0_4_;
            }
          }
          std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
          ::push_back(&local_1f8,(value_type *)local_268);
          local_1b0._0_8_ = pTVar3;
          std::__cxx11::ostringstream::ostringstream(this_01);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"// Got ",7);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_01,(pBVar13->name)._M_dataplus._M_p,
                     (pBVar13->name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," value ",7);
          apiVarValueStr_abi_cxx11_(&local_1d0,(Functional *)local_268,value_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_01,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream(this_01);
          std::ios_base::~ios_base(local_138);
        }
        if (local_218[0].m_log != local_208) {
          operator_delete(local_218[0].m_log,(ulong)((long)&(local_208[0].m_log)->flags + 1));
        }
        lVar12 = lVar12 + 1;
        pBVar10 = (basicUniforms->
                  super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      } while (lVar12 < (int)((ulong)((long)(basicUniforms->
                                            super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pBVar10) >> 3) * 0x286bca1b);
    }
    tcu::TestLog::endSection(local_1d8.m_log);
    if (bVar6) {
      local_1b0._0_8_ = (TestLog *)(local_1b0 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"ValueCheck","");
      _local_268 = (pointer)local_258;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_268,"Verify that the reported values match the assigned values","")
      ;
      tcu::ScopedLogSection::ScopedLogSection
                (local_218,local_220,(string *)local_1b0,(string *)local_268);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_268 != local_258) {
        operator_delete(_local_268,local_258[0]._M_allocated_capacity + 1);
      }
      if ((TestLog *)local_1b0._0_8_ != (TestLog *)(local_1b0 + 0x10)) {
        operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
      }
      pVVar5 = local_1f8.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pBVar10 = (basicUniforms->
                super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((int)((ulong)((long)(basicUniforms->
                              super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar10) >> 3) *
          0x286bca1b < 1) {
        bVar6 = true;
      }
      else {
        pTVar3 = ((this->super_UniformCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
                 ->m_log;
        paVar16 = &(local_1f8.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                    ._M_impl.super__Vector_impl_data._M_start)->val;
        bVar6 = true;
        lVar15 = 0x2c;
        lVar12 = 0;
        do {
          local_1b0._0_8_ = pTVar3;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b0 + 8),"// Checking uniform ",0x14);
          pBVar13 = pBVar10 + lVar12;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b0 + 8),(pBVar13->name)._M_dataplus._M_p,
                     (pBVar13->name)._M_string_length);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          pVVar14 = pVVar5 + lVar12;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
          std::ios_base::~ios_base(local_138);
          if (pVVar14->type != TYPE_INVALID) {
            uVar7 = glu::getDataTypeScalarSize(pVVar14->type);
            DVar2 = pVVar14->type;
            if ((DVar2 - TYPE_FLOAT < 4) ||
               (DVar2 - TYPE_FLOAT_MAT2 < 9 || DVar2 - TYPE_DOUBLE_MAT2 < 9)) {
              if (0 < (int)uVar7) {
                uVar11 = 0;
                do {
                  fVar17 = paVar16->floatV[uVar11] -
                           *(float *)((long)&(pBVar10->name)._M_dataplus._M_p + uVar11 * 4 + lVar15)
                  ;
                  fVar18 = -fVar17;
                  if (-fVar17 <= fVar17) {
                    fVar18 = fVar17;
                  }
                  if (0.05 <= fVar18) goto LAB_0051fec4;
                  uVar11 = uVar11 + 1;
                } while (uVar7 != uVar11);
              }
            }
            else if (DVar2 - TYPE_INT < 4) {
              if (0 < (int)uVar7) {
                uVar11 = 0;
                do {
                  if (paVar16->intV[uVar11] !=
                      *(int *)((long)&(pBVar10->name)._M_dataplus._M_p + uVar11 * 4 + lVar15))
                  goto LAB_0051fec4;
                  uVar11 = uVar11 + 1;
                } while (uVar7 != uVar11);
              }
            }
            else if (DVar2 - TYPE_UINT < 4) {
              if (0 < (int)uVar7) {
                uVar11 = 0;
                do {
                  if (paVar16->intV[uVar11] !=
                      *(int *)((long)&(pBVar10->name)._M_dataplus._M_p + uVar11 * 4 + lVar15))
                  goto LAB_0051fec4;
                  uVar11 = uVar11 + 1;
                } while (uVar7 != uVar11);
              }
            }
            else if (DVar2 - TYPE_BOOL < 4) {
              if (0 < (int)uVar7) {
                uVar11 = 0;
                do {
                  if (paVar16->boolV[uVar11] !=
                      (bool)*(char *)((long)&(pBVar10->name)._M_dataplus._M_p + uVar11 + lVar15))
                  goto LAB_0051fec4;
                  uVar11 = uVar11 + 1;
                } while (uVar7 != uVar11);
              }
            }
            else if ((DVar2 - TYPE_SAMPLER_1D < 0x1e) &&
                    ((pVVar14->val).intV[0] != (pBVar13->finalValue).val.intV[0])) {
LAB_0051fec4:
              local_1b0._0_8_ = pTVar3;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
              this_03 = (ostream *)(local_1b0 + 8);
              std::__ostream_insert<char,std::char_traits<char>>
                        (this_03,"// FAILURE: value obtained with glGetUniform*() for uniform ",0x3c
                        );
              std::__ostream_insert<char,std::char_traits<char>>
                        (this_03,(pBVar13->name)._M_dataplus._M_p,(pBVar13->name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (this_03," differs from value set with glProgramUniform*()",0x30);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_03);
              std::ios_base::~ios_base(local_138);
              bVar6 = false;
            }
          }
          lVar12 = lVar12 + 1;
          pBVar10 = (basicUniforms->
                    super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          lVar15 = lVar15 + 0x98;
          paVar16 = (anon_union_64_5_83fd6269_for_val *)((long)paVar16 + 0x44);
        } while (lVar12 < (int)((ulong)((long)(basicUniforms->
                                              super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                                              )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pBVar10) >> 3) * 0x286bca1b);
      }
      tcu::TestLog::endSection(local_218[0].m_log);
      if (local_1f8.
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1f8.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_1f8.
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1f8.
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (bVar6) {
        return true;
      }
    }
    else if (local_1f8.
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
             ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    local_1b0._0_8_ = pTVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"RenderTest","");
    _local_268 = (pointer)local_258;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"Render test","");
    tcu::ScopedLogSection::ScopedLogSection
              (local_218,local_220,(string *)local_1b0,(string *)local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_268 != local_258) {
      operator_delete(_local_268,local_258[0]._M_allocated_capacity + 1);
    }
    if ((TestLog *)local_1b0._0_8_ != pTVar3) {
      operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
    }
    bVar6 = UniformCase::renderTest(&this->super_UniformCase,basicUniforms,program,rnd);
    tcu::TestLog::endSection(local_218[0].m_log);
    if (bVar6) {
      return true;
    }
  }
  return false;
}

Assistant:

bool UniformAssignCase::test (const vector<BasicUniform>& basicUniforms, const vector<BasicUniformReportRef>& basicUniformReportsRef, const ShaderProgram& program, Random& rnd)
{
	DE_UNREF(basicUniformReportsRef);

	const deUint32	programGL	= program.getProgram();
	TestLog&		log			= m_testCtx.getLog();

	{
		const ScopedLogSection section(log, "UniformAssign", "Uniform value assignments");
		assignUniforms(basicUniforms, programGL, rnd);
	}

	if (m_checkMethod == CHECKMETHOD_GET_UNIFORM)
	{
		vector<VarValue> values;

		{
			const ScopedLogSection section(log, "GetUniforms", "Uniform value query");
			const bool success = getUniforms(values, basicUniforms, program.getProgram());

			if (!success)
				return false;
		}

		{
			const ScopedLogSection section(log, "ValueCheck", "Verify that the reported values match the assigned values");
			const bool success = compareUniformValues(values, basicUniforms);

			if (!success)
				return false;
		}
	}
	else
	{
		DE_ASSERT(m_checkMethod == CHECKMETHOD_RENDER);

		const ScopedLogSection section(log, "RenderTest", "Render test");
		const bool success = renderTest(basicUniforms, program, rnd);

		if (!success)
			return false;
	}

	return true;
}